

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O0

idx_t duckdb::TemplatedMatch<false,duckdb::interval_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  bool bVar1;
  long in_RSI;
  idx_t in_stack_00000078;
  Vector *in_stack_00000080;
  TupleDataLayout *in_stack_00000088;
  idx_t in_stack_00000090;
  SelectionVector *in_stack_00000098;
  TupleDataVectorFormat *in_stack_000000a0;
  SelectionVector *in_stack_000000b0;
  idx_t *in_stack_000000b8;
  undefined8 local_8;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                    ((TemplatedValidityMask<unsigned_long> *)(in_RSI + 0x30));
  if (bVar1) {
    local_8 = TemplatedMatchLoop<false,duckdb::interval_t,duckdb::NotDistinctFrom,true>
                        (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
                         in_stack_00000080,in_stack_00000078,in_stack_000000b0,in_stack_000000b8);
  }
  else {
    local_8 = TemplatedMatchLoop<false,duckdb::interval_t,duckdb::NotDistinctFrom,false>
                        (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
                         in_stack_00000080,in_stack_00000078,in_stack_000000b0,in_stack_000000b8);
  }
  return local_8;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}